

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

uint stb_decompress(uchar *output,uchar *i,uint param_3)

{
  uint buflen;
  uint uVar1;
  uchar *puVar2;
  uchar *old_i;
  uint olen;
  uint param_2_local;
  uchar *i_local;
  uchar *output_local;
  
  if (((uint)*i * 0x1000000 + (uint)i[1] * 0x10000 + (uint)i[2] * 0x100 + (uint)i[3] == 0x57bc0000)
     && ((uint)i[4] * 0x1000000 + (uint)i[5] * 0x10000 + (uint)i[6] * 0x100 + (uint)i[7] == 0)) {
    buflen = stb_decompress_length(i);
    stb__barrier_out_e = output + buflen;
    stb__barrier_in_b = i;
    stb__barrier_out_b = output;
    stb__dout = output;
    _olen = i + 0x10;
    do {
      puVar2 = stb_decompress_token(_olen);
      if (puVar2 == _olen) {
        if ((*puVar2 != '\x05') || (puVar2[1] != 0xfa)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                        ,0xcaf,
                        "unsigned int stb_decompress(unsigned char *, const unsigned char *, unsigned int)"
                       );
        }
        if (stb__dout != output + buflen) {
          __assert_fail("stb__dout == output + olen",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                        ,0xca9,
                        "unsigned int stb_decompress(unsigned char *, const unsigned char *, unsigned int)"
                       );
        }
        if (stb__dout == output + buflen) {
          uVar1 = stb_adler32(1,output,buflen);
          if (uVar1 != (uint)puVar2[2] * 0x1000000 +
                       (uint)puVar2[3] * 0x10000 + (uint)puVar2[4] * 0x100 + (uint)puVar2[5]) {
            return 0;
          }
          return buflen;
        }
        return 0;
      }
      if (output + buflen < stb__dout) {
        __assert_fail("stb__dout <= output + olen",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                      ,0xcb3,
                      "unsigned int stb_decompress(unsigned char *, const unsigned char *, unsigned int)"
                     );
      }
      _olen = puVar2;
    } while (stb__dout <= output + buflen);
  }
  return 0;
}

Assistant:

static unsigned int stb_decompress(unsigned char *output, const unsigned char *i, unsigned int /*length*/)
{
    unsigned int olen;
    if (stb__in4(0) != 0x57bC0000) return 0;
    if (stb__in4(4) != 0)          return 0; // error! stream is > 4GB
    olen = stb_decompress_length(i);
    stb__barrier_in_b = i;
    stb__barrier_out_e = output + olen;
    stb__barrier_out_b = output;
    i += 16;

    stb__dout = output;
    for (;;) {
        const unsigned char *old_i = i;
        i = stb_decompress_token(i);
        if (i == old_i) {
            if (*i == 0x05 && i[1] == 0xfa) {
                IM_ASSERT(stb__dout == output + olen);
                if (stb__dout != output + olen) return 0;
                if (stb_adler32(1, output, olen) != (unsigned int) stb__in4(2))
                    return 0;
                return olen;
            } else {
                IM_ASSERT(0); /* NOTREACHED */
                return 0;
            }
        }
        IM_ASSERT(stb__dout <= output + olen);
        if (stb__dout > output + olen)
            return 0;
    }
}